

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O0

_Bool chunk_copy(chunk_conflict *dest,player *p,chunk_conflict *source,wchar_t y0,wchar_t x0,
                wchar_t rotate,_Bool reflect)

{
  wchar_t wVar1;
  wchar_t width;
  bitflag *flags1;
  monster_group *pmVar2;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc_conflict grid_04;
  loc_conflict grid_05;
  loc_conflict grid_06;
  loc_conflict grid_07;
  _Bool _Var3;
  square_conflict *psVar4;
  object *poVar5;
  monster_conflict *__src;
  monster_conflict *__dest;
  object **ppoVar6;
  undefined1 local_158 [8];
  ghost_info preserved_ghost;
  monster_conflict *mon;
  mon_group_list_entry *pmStack_98;
  wchar_t idx;
  mon_group_list_entry *entry;
  monster_group *group;
  object *obj_1;
  monster_conflict *dest_mon;
  monster_conflict *source_mon;
  trap *trap;
  object *obj;
  loc dest_grid;
  wchar_t skipped_ghost_id;
  wchar_t mon_skip;
  wchar_t w;
  wchar_t h;
  loc grid;
  wchar_t max_group_id;
  wchar_t i;
  _Bool reflect_local;
  wchar_t rotate_local;
  wchar_t x0_local;
  wchar_t y0_local;
  chunk_conflict *source_local;
  player *p_local;
  chunk_conflict *dest_local;
  
  grid.x = 0;
  wVar1 = source->height;
  width = source->width;
  dest_grid.y = dest->mon_max - 1;
  dest_grid.x = -1;
  if (rotate % 1 == 0) {
    if ((dest->height < wVar1 + y0) || (dest->width < width + x0)) {
      return false;
    }
  }
  else if ((dest->height < width + y0) || (dest->width < wVar1 + x0)) {
    return false;
  }
  for (h = L'\0'; h < wVar1; h = h + L'\x01') {
    for (w = L'\0'; w < width; w = w + L'\x01') {
      obj = (object *)CONCAT44(h,w);
      symmetry_transform((loc *)&obj,y0,x0,wVar1,width,rotate,reflect);
      grid_00.y = h;
      grid_00.x = w;
      psVar4 = square((chunk *)source,grid_00);
      dest->squares[obj._4_4_][(int)obj].feat = psVar4->feat;
      psVar4 = square((chunk *)dest,(loc_conflict)obj);
      flags1 = psVar4->info;
      grid_01.y = h;
      grid_01.x = w;
      psVar4 = square((chunk *)source,grid_01);
      flag_copy(flags1,psVar4->info,3);
      grid_02.y = h;
      grid_02.x = w;
      poVar5 = square_object((chunk *)source,grid_02);
      if (poVar5 != (object *)0x0) {
        grid_03.y = h;
        grid_03.x = w;
        poVar5 = square_object((chunk *)source,grid_03);
        dest->squares[obj._4_4_][(int)obj].obj = poVar5;
        grid_04.y = h;
        grid_04.x = w;
        for (trap = (trap *)square_object((chunk *)source,grid_04); trap != (trap *)0x0;
            trap = *(trap **)&trap->power) {
          *(object **)((long)&trap[1].kind + 4) = obj;
        }
        source->squares[h][w].obj = (object *)0x0;
      }
      grid_05.y = h;
      grid_05.x = w;
      psVar4 = square((chunk *)source,grid_05);
      if (psVar4->trap != (trap *)0x0) {
        grid_06.y = h;
        grid_06.x = w;
        psVar4 = square((chunk *)source,grid_06);
        source_mon = (monster_conflict *)psVar4->trap;
        dest->squares[obj._4_4_][(int)obj].trap = (trap *)source_mon;
        for (; source_mon != (monster_conflict *)0x0;
            source_mon = (monster_conflict *)source_mon->player_race) {
          source_mon->original_player_race = (player_race *)obj;
        }
        source->squares[h][w].trap = (trap *)0x0;
      }
      grid_07.y = h;
      grid_07.x = w;
      psVar4 = square((chunk *)source,grid_07);
      if (psVar4->mon == -1) {
        dest->squares[obj._4_4_][(int)obj].mon = -1;
        p->grid = (loc)obj;
      }
    }
  }
  dest->mon_max = dest->mon_max + source->mon_max;
  dest->mon_cnt = dest->mon_cnt + source->mon_cnt;
  dest->num_repro = source->num_repro + dest->num_repro;
  for (grid.y = 1; grid.y < (int)(uint)source->mon_max; grid.y = grid.y + 1) {
    __src = source->monsters + grid.y;
    __dest = dest->monsters + (dest_grid.y + grid.y);
    if (__src->race != (monster_race *)0x0) {
      if ((__src->race != (monster_race *)0x0) &&
         (_Var3 = flag_has_dbg(__src->race->flags,0xc,2,"source_mon->race->flags","RF_PLAYER_GHOST")
         , _Var3)) {
        if (dest->ghost->bones_selector == L'\0') {
          mem_free(dest->ghost);
          dest->ghost = source->ghost;
          source->ghost = (ghost_info *)0x0;
        }
        else {
          if (dest_grid.x != -1) {
            __assert_fail("skipped_ghost_id == -1",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                          ,0x1bb,
                          "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                         );
          }
          dest_grid.x = __src->midx + dest_grid.y;
        }
      }
      memcpy(__dest,__src,0x1f0);
      __dest->midx = dest_grid.y + __dest->midx;
      symmetry_transform(&__dest->grid,y0,x0,wVar1,width,rotate,reflect);
      dest->squares[(__dest->grid).y][(__dest->grid).x].mon = (int16_t)__dest->midx;
      if (__src->held_obj != (object *)0x0) {
        __dest->held_obj = __src->held_obj;
        for (group = (monster_group *)__src->held_obj; group != (monster_group *)0x0;
            group = (monster_group *)group[1].player_race) {
          *(short *)((long)&group[0xc].player_race + 4) = (short)__dest->midx;
        }
        __src->held_obj = (object *)0x0;
      }
      if (__src->mimicked_obj != (object *)0x0) {
        __dest->mimicked_obj = __src->mimicked_obj;
        __dest->mimicked_obj->mimicking_m_idx = (int16_t)__dest->midx;
        __src->mimicked_obj = (object *)0x0;
      }
    }
  }
  for (grid.y = 1; grid.y < (int)(uint)z_info->level_monster_max; grid.y = grid.y + 1) {
    if (dest->monster_groups[grid.y] != (monster_group *)0x0) {
      grid.x = grid.y;
    }
  }
  for (grid.y = 1; grid.y < (int)((uint)z_info->level_monster_max - grid.x); grid.y = grid.y + 1) {
    pmVar2 = source->monster_groups[grid.y];
    dest->monster_groups[grid.y + grid.x] = source->monster_groups[grid.y];
    if (pmVar2 != (monster_group *)0x0) {
      pmStack_98 = pmVar2->member_list;
      pmVar2->index = grid.x + pmVar2->index;
      pmVar2->leader = dest_grid.y + pmVar2->leader;
      for (; pmStack_98 != (mon_group_list_entry *)0x0; pmStack_98 = pmStack_98->next) {
        wVar1 = pmStack_98->midx;
        preserved_ghost._168_8_ = dest->monsters + (dest_grid.y + wVar1);
        pmStack_98->midx = ((monster_conflict *)preserved_ghost._168_8_)->midx;
        if (pmStack_98->midx != dest_grid.y + wVar1) {
          __assert_fail("entry->midx == mon_skip + idx",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                        ,0x1f6,
                        "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                       );
        }
        ((monster_conflict *)preserved_ghost._168_8_)->group_info[0].index =
             grid.x + ((monster_conflict *)preserved_ghost._168_8_)->group_info[0].index;
      }
    }
  }
  monster_groups_verify((chunk *)dest);
  ppoVar6 = (object **)
            mem_realloc(dest->objects,
                        (long)(int)((uint)dest->obj_max + (uint)source->obj_max + 2) << 3);
  dest->objects = ppoVar6;
  for (grid.y = 0; grid.y <= (int)(uint)source->obj_max; grid.y = grid.y + 1) {
    dest->objects[(int)((uint)dest->obj_max + grid.y)] = source->objects[grid.y];
    if (dest->objects[(int)((uint)dest->obj_max + grid.y)] != (object *)0x0) {
      dest->objects[(int)((uint)dest->obj_max + grid.y)]->oidx = dest->obj_max + (short)grid.y;
    }
    source->objects[grid.y] = (object *)0x0;
  }
  dest->obj_max = dest->obj_max + source->obj_max + 1;
  source->obj_max = 1;
  object_lists_check_integrity(dest,(chunk_conflict *)0x0);
  for (grid.y = 0; grid.y < (int)(z_info->f_max + 1); grid.y = grid.y + 1) {
    dest->feat_count[grid.y] = source->feat_count[grid.y] + dest->feat_count[grid.y];
  }
  if (dest->obj_rating < -source->obj_rating - 1) {
    dest->obj_rating = source->obj_rating + dest->obj_rating;
  }
  else {
    dest->obj_rating = 0xffffffff;
  }
  add_to_monster_rating((chunk *)dest,source->mon_rating);
  if ((source->good_item & 1U) != 0) {
    dest->good_item = true;
  }
  if (dest_grid.x != -1) {
    memcpy(local_158,dest->ghost,0xb0);
    delete_monster_idx((chunk *)dest,dest_grid.x);
    memcpy(dest->ghost,local_158,0xb0);
    if (dest->mon_rating != 0xffffffff) {
      if (dest->mon_rating < 10) {
        __assert_fail("dest->mon_rating >= 10",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                      ,0x229,
                      "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                     );
      }
      dest->mon_rating = dest->mon_rating - 10;
    }
  }
  return true;
}

Assistant:

bool chunk_copy(struct chunk *dest, struct player *p, struct chunk *source,
		int y0, int x0, int rotate, bool reflect)
{
	int i, max_group_id = 0;
	struct loc grid;
	int h = source->height, w = source->width;
	int mon_skip = dest->mon_max - 1;
	int skipped_ghost_id = -1;

	/* Check bounds */
	if (rotate % 1) {
		if ((w + y0 > dest->height) || (h + x0 > dest->width))
			return false;
	} else {
		if ((h + y0 > dest->height) || (w + x0 > dest->width))
			return false;
	}

	/* Write the location stuff (terrain, objects, traps) */
	for (grid.y = 0; grid.y < h; grid.y++) {
		for (grid.x = 0; grid.x < w; grid.x++) {
			/* Work out where we're going */
			struct loc dest_grid = grid;
			symmetry_transform(&dest_grid, y0, x0, h, w, rotate, reflect);

			/* Terrain */
			dest->squares[dest_grid.y][dest_grid.x].feat =
				square(source, grid)->feat;
			sqinfo_copy(square(dest, dest_grid)->info,
						square(source, grid)->info);

			/* Dungeon objects */
			if (square_object(source, grid)) {
				struct object *obj;
				dest->squares[dest_grid.y][dest_grid.x].obj =
					square_object(source, grid);

				for (obj = square_object(source, grid); obj; obj = obj->next) {
					/* Adjust position */
					obj->grid = dest_grid;
				}
				source->squares[grid.y][grid.x].obj = NULL;
			}

			/* Traps */
			if (square(source, grid)->trap) {
				struct trap *trap = square(source, grid)->trap;
				dest->squares[dest_grid.y][dest_grid.x].trap = trap;

				/* Traverse the trap list */
				while (trap) {
					/* Adjust location */
					trap->grid = dest_grid;
					trap = trap->next;
				}
				source->squares[grid.y][grid.x].trap = NULL;
			}

			/* Player */
			if (square(source, grid)->mon == -1) {
				dest->squares[dest_grid.y][dest_grid.x].mon = -1;
				p->grid = dest_grid;
			}
		}
	}

	/* Monsters */
	dest->mon_max += source->mon_max;
	dest->mon_cnt += source->mon_cnt;
	dest->num_repro += source->num_repro;
	for (i = 1; i < source->mon_max; i++) {
		struct monster *source_mon = &source->monsters[i];
		struct monster *dest_mon = &dest->monsters[mon_skip + i];

		/* Valid monster */
		if (!source_mon->race) continue;

		/* Deal with player ghosts */
		if (source_mon->race &&
			rf_has(source_mon->race->flags, RF_PLAYER_GHOST)) {
			/*
			 * Only allow one ghost, preferring the ghost from
			 * the destination if both chunks have a ghost.
			 * Remember a ghost from the source that was not
			 * put in dest->ghost so it can be deleted once the
			 * monsters and monster groups are copied.
			 */
			if (dest->ghost->bones_selector) {
				/* source should not have multiple ghosts. */
				assert(skipped_ghost_id == -1);
				skipped_ghost_id = source_mon->midx + mon_skip;
			} else {
				/* Shift the ghost */
				mem_free(dest->ghost);
				dest->ghost = source->ghost;
				source->ghost = NULL;
			}
		}

		/* Copy */
		memcpy(dest_mon, source_mon, sizeof(struct monster));

		/* Adjust monster index */
		dest_mon->midx += mon_skip;

		/* Move grid */
		symmetry_transform(&dest_mon->grid, y0, x0, h, w, rotate, reflect);
		dest->squares[dest_mon->grid.y][dest_mon->grid.x].mon = dest_mon->midx;

		/* Held or mimicked objects */
		if (source_mon->held_obj) {
			struct object *obj;
			dest_mon->held_obj = source_mon->held_obj;
			for (obj = source_mon->held_obj; obj; obj = obj->next) {
				obj->held_m_idx = dest_mon->midx;
			}
			source_mon->held_obj = NULL;
		}
		if (source_mon->mimicked_obj) {
			dest_mon->mimicked_obj = source_mon->mimicked_obj;
			dest_mon->mimicked_obj->mimicking_m_idx =
				dest_mon->midx;
			source_mon->mimicked_obj = NULL;
		}
	}

	/* Find max monster group id */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (dest->monster_groups[i]) max_group_id = i;
	}

	/* Copy monster groups */
	for (i = 1; i < z_info->level_monster_max - max_group_id; i++) {
		struct monster_group *group = source->monster_groups[i];
		struct mon_group_list_entry *entry;

		/* Copy monster group list */
		dest->monster_groups[i + max_group_id] = source->monster_groups[i];

		/* Adjust monster group indices */
		if (!group) continue;
		entry = group->member_list;
		group->index += max_group_id;
		group->leader += mon_skip;
		while (entry) {
			int idx = entry->midx;
			struct monster *mon = &dest->monsters[mon_skip + idx];
			entry->midx = mon->midx;
			assert(entry->midx == mon_skip + idx);
			mon->group_info[0].index += max_group_id;
			entry = entry->next;
		}
	}
	monster_groups_verify(dest);

	/* Copy object list */
	dest->objects = mem_realloc(dest->objects,
								(dest->obj_max + source->obj_max + 2)
								* sizeof(struct object*));
	for (i = 0; i <= source->obj_max; i++) {
		dest->objects[dest->obj_max + i] = source->objects[i];
		if (dest->objects[dest->obj_max + i] != NULL)
			dest->objects[dest->obj_max + i]->oidx = dest->obj_max + i;
		source->objects[i] = NULL;
	}
	dest->obj_max += source->obj_max + 1;
	source->obj_max = 1;
	object_lists_check_integrity(dest, NULL);

	/* Miscellany */
	for (i = 0; i < z_info->f_max + 1; i++)
		dest->feat_count[i] += source->feat_count[i];

	if (dest->obj_rating < UINT32_MAX - source->obj_rating) {
		dest->obj_rating += source->obj_rating;
	} else {
		dest->obj_rating = UINT32_MAX;
	}
	add_to_monster_rating(dest, source->mon_rating);

	if (source->good_item)
		dest->good_item = true;

	if (skipped_ghost_id != -1) {
		/*
		 * dest->ghost does not refer to the ghost at skipped_ghost_id
		 * so remember it and restore it after delete_monster_idx()
		 * does its work.
		 */
		struct ghost_info preserved_ghost = *dest->ghost;

		delete_monster_idx(dest, skipped_ghost_id);
		*dest->ghost = preserved_ghost;
		/*
		 * Compensate for the change to monster rating, but do
		 * nothing if it saturated:  do not know what to subtract
		 * in that case.
		 */
		if (dest->mon_rating != UINT32_MAX) {
			assert(dest->mon_rating >= 10);
			dest->mon_rating -= 10;
		}
	}

	return true;
}